

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorBuilder::BuildFile(DescriptorBuilder *this,FileDescriptorProto *proto)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  pointer pbVar1;
  string *psVar2;
  size_t __n;
  DescriptorPool *this_01;
  pointer pcVar3;
  FileDescriptorTables *pFVar4;
  DescriptorBuilder *this_02;
  int iVar5;
  const_iterator cVar6;
  Type *pTVar7;
  FileDescriptor *pFVar8;
  Tables *pTVar9;
  long lVar10;
  FileDescriptorProto *pFVar11;
  long lVar12;
  DescriptorPool *this_03;
  size_type *psVar13;
  bool bVar14;
  undefined1 local_160 [8];
  FileDescriptorProto existing_proto;
  size_t local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  DescriptorBuilder *local_48;
  Tables *local_40;
  FileDescriptorProto *local_38;
  
  local_38 = proto;
  std::__cxx11::string::_M_assign((string *)&this->filename_);
  local_160 = (undefined1  [8])(this->filename_)._M_dataplus._M_p;
  cVar6 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->tables_->files_by_name_)._M_h,(key_type *)local_160);
  if ((cVar6.
       super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
       ._M_cur != (__node_type *)0x0) &&
     (pFVar8 = *(FileDescriptor **)
                ((long)cVar6.
                       super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                       ._M_cur + 0x10), pFVar8 != (FileDescriptor *)0x0)) {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_160,(Arena *)0x0);
    FileDescriptor::CopyTo(pFVar8,(FileDescriptorProto *)local_160);
    if ((*(int *)(pFVar8 + 0x3c) == 2) && (((local_38->_has_bits_).has_bits_[0] & 4) != 0)) {
      existing_proto.super_Message.super_MessageLite._internal_metadata_.ptr_._0_1_ =
           (byte)existing_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ | 4;
      local_68._0_8_ = (Arena *)(local_68 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)(local_78 + 0x10),"proto2","");
      if (((ulong)existing_proto.super_Message.super_MessageLite._vptr_MessageLite & 1) != 0) {
        existing_proto.super_Message.super_MessageLite._vptr_MessageLite =
             *(_func_int ***)
              ((ulong)existing_proto.super_Message.super_MessageLite._vptr_MessageLite &
              0xfffffffffffffffe);
      }
      if (existing_proto.package_.ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_
         ) {
        internal::ArenaStringPtr::CreateInstance
                  (&existing_proto.package_,
                   (Arena *)existing_proto.super_Message.super_MessageLite._vptr_MessageLite,
                   (string *)(local_78 + 0x10));
      }
      else {
        std::__cxx11::string::_M_assign((string *)existing_proto.package_.ptr_);
      }
      if ((Arena *)local_68._0_8_ != (Arena *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_);
      }
    }
    MessageLite::SerializeAsString_abi_cxx11_((string *)(local_78 + 0x10),(MessageLite *)local_160);
    MessageLite::SerializeAsString_abi_cxx11_
              ((string *)&existing_proto.source_code_info_,(MessageLite *)local_38);
    if (local_68._8_8_ == local_80) {
      if (local_68._8_8_ == 0) {
        bVar14 = true;
      }
      else {
        iVar5 = bcmp((void *)local_68._0_8_,existing_proto.source_code_info_,local_68._8_8_);
        bVar14 = iVar5 == 0;
      }
    }
    else {
      bVar14 = false;
    }
    if (existing_proto.source_code_info_ != (SourceCodeInfo *)local_78) {
      operator_delete(existing_proto.source_code_info_);
    }
    if ((Arena *)local_68._0_8_ != (Arena *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_);
    }
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_160);
    if (bVar14) {
      return pFVar8;
    }
  }
  local_40 = this->tables_;
  pbVar1 = (local_40->pending_files_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(local_40->pending_files_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  local_48 = this;
  if (lVar10 != 0) {
    lVar10 = lVar10 >> 5;
    psVar2 = (local_38->name_).ptr_;
    __n = psVar2->_M_string_length;
    psVar13 = &pbVar1->_M_string_length;
    lVar12 = 0;
    do {
      if ((*psVar13 == __n) &&
         ((__n == 0 ||
          (iVar5 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar13 + -1))->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,__n),
          iVar5 == 0)))) {
        AddRecursiveImportError(local_48,local_38,(int)lVar12);
        goto LAB_0027277a;
      }
      lVar12 = lVar12 + 1;
      psVar13 = psVar13 + 4;
    } while (lVar10 + (ulong)(lVar10 == 0) != lVar12);
  }
  pFVar11 = local_38;
  this_02 = local_48;
  pTVar9 = local_40;
  if ((local_48->pool_->lazily_build_dependencies_ == false) &&
     (local_48->pool_->fallback_database_ != (DescriptorDatabase *)0x0)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_40->pending_files_,(local_38->name_).ptr_);
    if (0 < (pFVar11->dependency_).super_RepeatedPtrFieldBase.current_size_) {
      this_00 = &local_38->dependency_;
      iVar5 = 0;
      do {
        pTVar9 = this_02->tables_;
        pTVar7 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                           (&this_00->super_RepeatedPtrFieldBase,iVar5);
        local_160 = (undefined1  [8])(pTVar7->_M_dataplus)._M_p;
        cVar6 = std::
                _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(pTVar9->files_by_name_)._M_h,(key_type *)local_160);
        if ((cVar6.
             super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
             ._M_cur == (__node_type *)0x0) ||
           (*(long *)((long)cVar6.
                            super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                            ._M_cur + 0x10) == 0)) {
          this_03 = this_02->pool_;
          this_01 = this_03->underlay_;
          if (this_01 != (DescriptorPool *)0x0) {
            pTVar7 = internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                               (&this_00->super_RepeatedPtrFieldBase,iVar5);
            pFVar8 = DescriptorPool::FindFileByName(this_01,pTVar7);
            if (pFVar8 != (FileDescriptor *)0x0) goto LAB_002726de;
            this_03 = this_02->pool_;
          }
          pTVar7 = internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                             (&this_00->super_RepeatedPtrFieldBase,iVar5);
          DescriptorPool::TryFindFileInFallbackDatabase(this_03,pTVar7);
        }
LAB_002726de:
        iVar5 = iVar5 + 1;
      } while (iVar5 < (local_38->dependency_).super_RepeatedPtrFieldBase.current_size_);
    }
    pTVar9 = this_02->tables_;
    pbVar1 = (pTVar9->pending_files_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (pTVar9->pending_files_).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar1 + -1;
    pcVar3 = pbVar1[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar1[-1].field_2) {
      operator_delete(pcVar3);
      pTVar9 = this_02->tables_;
    }
  }
  DescriptorPool::Tables::AddCheckpoint(pTVar9);
  pFVar11 = local_38;
  pFVar8 = BuildFileImpl(this_02,local_38);
  pFVar4 = this_02->file_tables_;
  std::
  unique_ptr<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  ::operator=(&pFVar4->fields_by_lowercase_name_tmp_,pFVar11);
  std::
  unique_ptr<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>,_std::default_delete<std::unordered_map<std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_const_google::protobuf::FieldDescriptor_*>_>_>_>_>
  ::operator=(&pFVar4->fields_by_camelcase_name_tmp_,pFVar11);
  if (pFVar8 == (FileDescriptor *)0x0) {
    DescriptorPool::Tables::RollbackToLastCheckpoint(this_02->tables_);
LAB_0027277a:
    pFVar8 = (FileDescriptor *)0x0;
  }
  else {
    DescriptorPool::Tables::ClearLastCheckpoint(this_02->tables_);
    pFVar8[0x41] = (FileDescriptor)0x1;
  }
  return pFVar8;
}

Assistant:

const FileDescriptor* DescriptorBuilder::BuildFile(
    const FileDescriptorProto& proto) {
  filename_ = proto.name();

  // Check if the file already exists and is identical to the one being built.
  // Note:  This only works if the input is canonical -- that is, it
  //   fully-qualifies all type names, has no UninterpretedOptions, etc.
  //   This is fine, because this idempotency "feature" really only exists to
  //   accommodate one hack in the proto1->proto2 migration layer.
  const FileDescriptor* existing_file = tables_->FindFile(filename_);
  if (existing_file != nullptr) {
    // File already in pool.  Compare the existing one to the input.
    if (ExistingFileMatchesProto(existing_file, proto)) {
      // They're identical.  Return the existing descriptor.
      return existing_file;
    }

    // Not a match.  The error will be detected and handled later.
  }

  // Check to see if this file is already on the pending files list.
  // TODO(kenton):  Allow recursive imports?  It may not work with some
  //   (most?) programming languages.  E.g., in C++, a forward declaration
  //   of a type is not sufficient to allow it to be used even in a
  //   generated header file due to inlining.  This could perhaps be
  //   worked around using tricks involving inserting #include statements
  //   mid-file, but that's pretty ugly, and I'm pretty sure there are
  //   some languages out there that do not allow recursive dependencies
  //   at all.
  for (int i = 0; i < tables_->pending_files_.size(); i++) {
    if (tables_->pending_files_[i] == proto.name()) {
      AddRecursiveImportError(proto, i);
      return nullptr;
    }
  }

  // If we have a fallback_database_, and we aren't doing lazy import building,
  // attempt to load all dependencies now, before checkpointing tables_.  This
  // avoids confusion with recursive checkpoints.
  if (!pool_->lazily_build_dependencies_) {
    if (pool_->fallback_database_ != nullptr) {
      tables_->pending_files_.push_back(proto.name());
      for (int i = 0; i < proto.dependency_size(); i++) {
        if (tables_->FindFile(proto.dependency(i)) == nullptr &&
            (pool_->underlay_ == nullptr ||
             pool_->underlay_->FindFileByName(proto.dependency(i)) ==
                 nullptr)) {
          // We don't care what this returns since we'll find out below anyway.
          pool_->TryFindFileInFallbackDatabase(proto.dependency(i));
        }
      }
      tables_->pending_files_.pop_back();
    }
  }

  // Checkpoint the tables so that we can roll back if something goes wrong.
  tables_->AddCheckpoint();

  FileDescriptor* result = BuildFileImpl(proto);

  file_tables_->FinalizeTables();
  if (result) {
    tables_->ClearLastCheckpoint();
    result->finished_building_ = true;
  } else {
    tables_->RollbackToLastCheckpoint();
  }

  return result;
}